

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprAssignXNext(Fts5ExprNode *pNode)

{
  int iVar1;
  Fts5ExprPhrase *pFVar2;
  code *pcVar3;
  
  iVar1 = pNode->eType;
  if (iVar1 == 1) {
    pcVar3 = fts5ExprNodeNext_OR;
  }
  else if (iVar1 == 2) {
    pcVar3 = fts5ExprNodeNext_AND;
  }
  else if (iVar1 == 9) {
    pcVar3 = fts5ExprNodeNext_STRING;
    if ((((pNode->pNear->nPhrase == 1) && (pFVar2 = pNode->pNear->apPhrase[0], pFVar2->nTerm == 1))
        && (pFVar2->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0)) && (pFVar2->aTerm[0].bFirst == '\0'))
    {
      pNode->eType = 4;
      pcVar3 = fts5ExprNodeNext_TERM;
    }
  }
  else {
    pcVar3 = fts5ExprNodeNext_NOT;
  }
  pNode->xNext = pcVar3;
  return;
}

Assistant:

static void fts5ExprAssignXNext(Fts5ExprNode *pNode){
  switch( pNode->eType ){
    case FTS5_STRING: {
      Fts5ExprNearset *pNear = pNode->pNear;
      if( pNear->nPhrase==1 && pNear->apPhrase[0]->nTerm==1
       && pNear->apPhrase[0]->aTerm[0].pSynonym==0
       && pNear->apPhrase[0]->aTerm[0].bFirst==0
      ){
        pNode->eType = FTS5_TERM;
        pNode->xNext = fts5ExprNodeNext_TERM;
      }else{
        pNode->xNext = fts5ExprNodeNext_STRING;
      }
      break;
    };

    case FTS5_OR: {
      pNode->xNext = fts5ExprNodeNext_OR;
      break;
    };

    case FTS5_AND: {
      pNode->xNext = fts5ExprNodeNext_AND;
      break;
    };

    default: assert( pNode->eType==FTS5_NOT ); {
      pNode->xNext = fts5ExprNodeNext_NOT;
      break;
    };
  }
}